

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O2

void __thiscall blc::network::Client::Client(Client *this,int socket,sockaddr_in addr)

{
  Socket::Socket(&this->super_Socket);
  (this->super_Socket).super_stream._vptr_stream = (_func_int **)&PTR_write_0011a9c0;
  (this->super_Socket)._socket = socket;
  inet_ntoa((in_addr_t)addr.sin_addr.s_addr);
  std::__cxx11::string::assign((char *)&(this->super_Socket)._address);
  (this->super_Socket)._port = (uint)(ushort)(addr.sin_port << 8 | addr.sin_port >> 8);
  (this->super_Socket)._opened = true;
  return;
}

Assistant:

blc::network::Client::Client(int socket, struct sockaddr_in addr) : Socket() {
	struct sockaddr_in data;

	data = *((struct sockaddr_in*)(&addr));
	this->_socket = socket;
	this->_address = inet_ntoa(data.sin_addr);
	this->_port = ntohs(data.sin_port);
	this->_opened = true;
}